

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::PreLoadCMakeFiles(cmake *this)

{
  bool bVar1;
  char *pcVar2;
  char *__s;
  string pre_load;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  allocator local_59;
  long *local_58;
  char *local_50;
  long local_48 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = cmState::GetSourceDirectory(this->State);
  std::__cxx11::string::string((string *)&local_58,pcVar2,&local_59);
  if (local_50 != (char *)0x0) {
    std::__cxx11::string::append((char *)&local_58);
    bVar1 = cmsys::SystemTools::FileExists((char *)local_58);
    if (bVar1) {
      ReadListFile(this,&local_38,(char *)local_58);
    }
  }
  __s = cmState::GetBinaryDirectory(this->State);
  pcVar2 = local_50;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_58,0,pcVar2,(ulong)__s);
  if (local_50 != (char *)0x0) {
    std::__cxx11::string::append((char *)&local_58);
    bVar1 = cmsys::SystemTools::FileExists((char *)local_58);
    if (bVar1) {
      ReadListFile(this,&local_38,(char *)local_58);
    }
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

void cmake::PreLoadCMakeFiles()
{
  std::vector<std::string> args;
  std::string pre_load = this->GetHomeDirectory();
  if (!pre_load.empty())
    {
    pre_load += "/PreLoad.cmake";
    if ( cmSystemTools::FileExists(pre_load.c_str()) )
      {
      this->ReadListFile(args, pre_load.c_str());
      }
    }
  pre_load = this->GetHomeOutputDirectory();
  if (!pre_load.empty())
    {
    pre_load += "/PreLoad.cmake";
    if ( cmSystemTools::FileExists(pre_load.c_str()) )
      {
      this->ReadListFile(args, pre_load.c_str());
      }
    }
}